

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void gen_store_exclusive(DisasContext_conflict1 *s,int rd,int rt,int rt2,TCGv_i64 addr,int size,
                        int is_pair)

{
  TCGContext_conflict1 *s_00;
  TCGv_ptr pTVar1;
  int iVar2;
  uint32_t uVar3;
  TCGLabel *l;
  TCGLabel *l_00;
  TCGv_i64 pTVar4;
  TCGv_i64 pTVar5;
  TCGv_i64 pTVar6;
  TCGv_i64 pTVar7;
  TCGv_i64 tmp;
  TCGLabel *done_label;
  TCGLabel *fail_label;
  TCGContext_conflict1 *tcg_ctx;
  int size_local;
  TCGv_i64 addr_local;
  int rt2_local;
  int rt_local;
  int rd_local;
  DisasContext_conflict1 *s_local;
  
  s_00 = s->uc->tcg_ctx;
  l = gen_new_label_aarch64(s_00);
  l_00 = gen_new_label_aarch64(s_00);
  tcg_gen_brcond_i64_aarch64(s_00,TCG_COND_NE,addr,s_00->cpu_exclusive_addr,l);
  pTVar4 = tcg_temp_new_i64(s_00);
  if (is_pair == 0) {
    pTVar5 = s_00->cpu_exclusive_addr;
    pTVar6 = s_00->cpu_exclusive_val;
    pTVar7 = cpu_reg_aarch64(s,rt);
    iVar2 = get_mem_index(s);
    tcg_gen_atomic_cmpxchg_i64_aarch64
              (s_00,pTVar4,pTVar5,pTVar6,pTVar7,(long)iVar2,size | MO_ALIGN | s->be_data);
    tcg_gen_setcond_i64_aarch64(s_00,TCG_COND_NE,pTVar4,pTVar4,s_00->cpu_exclusive_val);
  }
  else if (size == 2) {
    if (s->be_data == MO_8) {
      pTVar5 = cpu_reg_aarch64(s,rt);
      pTVar6 = cpu_reg_aarch64(s,rt2);
      tcg_gen_concat32_i64(s_00,pTVar4,pTVar5,pTVar6);
    }
    else {
      pTVar5 = cpu_reg_aarch64(s,rt2);
      pTVar6 = cpu_reg_aarch64(s,rt);
      tcg_gen_concat32_i64(s_00,pTVar4,pTVar5,pTVar6);
    }
    pTVar5 = s_00->cpu_exclusive_addr;
    pTVar6 = s_00->cpu_exclusive_val;
    iVar2 = get_mem_index(s);
    tcg_gen_atomic_cmpxchg_i64_aarch64
              (s_00,pTVar4,pTVar5,pTVar6,pTVar4,(long)iVar2,s->be_data | (MO_ALIGN|MO_64));
    tcg_gen_setcond_i64_aarch64(s_00,TCG_COND_NE,pTVar4,pTVar4,s_00->cpu_exclusive_val);
  }
  else {
    uVar3 = tb_cflags((s->base).tb);
    if ((uVar3 & 0x80000) == 0) {
      if (s->be_data == MO_8) {
        pTVar1 = s_00->cpu_env;
        pTVar5 = s_00->cpu_exclusive_addr;
        pTVar6 = cpu_reg_aarch64(s,rt);
        pTVar7 = cpu_reg_aarch64(s,rt2);
        gen_helper_paired_cmpxchg64_le(s_00,pTVar4,pTVar1,pTVar5,pTVar6,pTVar7);
      }
      else {
        pTVar1 = s_00->cpu_env;
        pTVar5 = s_00->cpu_exclusive_addr;
        pTVar6 = cpu_reg_aarch64(s,rt);
        pTVar7 = cpu_reg_aarch64(s,rt2);
        gen_helper_paired_cmpxchg64_be(s_00,pTVar4,pTVar1,pTVar5,pTVar6,pTVar7);
      }
    }
    else if (s->be_data == MO_8) {
      pTVar1 = s_00->cpu_env;
      pTVar5 = s_00->cpu_exclusive_addr;
      pTVar6 = cpu_reg_aarch64(s,rt);
      pTVar7 = cpu_reg_aarch64(s,rt2);
      gen_helper_paired_cmpxchg64_le_parallel(s_00,pTVar4,pTVar1,pTVar5,pTVar6,pTVar7);
    }
    else {
      pTVar1 = s_00->cpu_env;
      pTVar5 = s_00->cpu_exclusive_addr;
      pTVar6 = cpu_reg_aarch64(s,rt);
      pTVar7 = cpu_reg_aarch64(s,rt2);
      gen_helper_paired_cmpxchg64_be_parallel(s_00,pTVar4,pTVar1,pTVar5,pTVar6,pTVar7);
    }
  }
  pTVar5 = cpu_reg_aarch64(s,rd);
  tcg_gen_mov_i64_aarch64(s_00,pTVar5,pTVar4);
  tcg_temp_free_i64(s_00,pTVar4);
  tcg_gen_br(s_00,l_00);
  gen_set_label(s_00,l);
  pTVar4 = cpu_reg_aarch64(s,rd);
  tcg_gen_movi_i64_aarch64(s_00,pTVar4,1);
  gen_set_label(s_00,l_00);
  tcg_gen_movi_i64_aarch64(s_00,s_00->cpu_exclusive_addr,-1);
  return;
}

Assistant:

static void gen_store_exclusive(DisasContext *s, int rd, int rt, int rt2,
                                TCGv_i64 addr, int size, int is_pair)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* if (env->exclusive_addr == addr && env->exclusive_val == [addr]
     *     && (!is_pair || env->exclusive_high == [addr + datasize])) {
     *     [addr] = {Rt};
     *     if (is_pair) {
     *         [addr + datasize] = {Rt2};
     *     }
     *     {Rd} = 0;
     * } else {
     *     {Rd} = 1;
     * }
     * env->exclusive_addr = -1;
     */
    TCGLabel *fail_label = gen_new_label(tcg_ctx);
    TCGLabel *done_label = gen_new_label(tcg_ctx);
    TCGv_i64 tmp;

    tcg_gen_brcond_i64(tcg_ctx, TCG_COND_NE, addr, tcg_ctx->cpu_exclusive_addr, fail_label);

    tmp = tcg_temp_new_i64(tcg_ctx);
    if (is_pair) {
        if (size == 2) {
            if (s->be_data == MO_LE) {
                tcg_gen_concat32_i64(tcg_ctx, tmp, cpu_reg(s, rt), cpu_reg(s, rt2));
            } else {
                tcg_gen_concat32_i64(tcg_ctx, tmp, cpu_reg(s, rt2), cpu_reg(s, rt));
            }
            tcg_gen_atomic_cmpxchg_i64(tcg_ctx, tmp, tcg_ctx->cpu_exclusive_addr,
                                       tcg_ctx->cpu_exclusive_val, tmp,
                                       get_mem_index(s),
                                       MO_64 | MO_ALIGN | s->be_data);
            tcg_gen_setcond_i64(tcg_ctx, TCG_COND_NE, tmp, tmp, tcg_ctx->cpu_exclusive_val);
        } else if (tb_cflags(s->base.tb) & CF_PARALLEL) {
            if (!HAVE_CMPXCHG128) {
                gen_helper_exit_atomic(tcg_ctx, tcg_ctx->cpu_env);
                s->base.is_jmp = DISAS_NORETURN;
            } else if (s->be_data == MO_LE) {
                gen_helper_paired_cmpxchg64_le_parallel(tcg_ctx, tmp, tcg_ctx->cpu_env,
                                                        tcg_ctx->cpu_exclusive_addr,
                                                        cpu_reg(s, rt),
                                                        cpu_reg(s, rt2));
            } else {
                gen_helper_paired_cmpxchg64_be_parallel(tcg_ctx, tmp, tcg_ctx->cpu_env,
                                                        tcg_ctx->cpu_exclusive_addr,
                                                        cpu_reg(s, rt),
                                                        cpu_reg(s, rt2));
            }
        } else if (s->be_data == MO_LE) {
            gen_helper_paired_cmpxchg64_le(tcg_ctx, tmp, tcg_ctx->cpu_env, tcg_ctx->cpu_exclusive_addr,
                                           cpu_reg(s, rt), cpu_reg(s, rt2));
        } else {
            gen_helper_paired_cmpxchg64_be(tcg_ctx, tmp, tcg_ctx->cpu_env, tcg_ctx->cpu_exclusive_addr,
                                           cpu_reg(s, rt), cpu_reg(s, rt2));
        }
    } else {
        tcg_gen_atomic_cmpxchg_i64(tcg_ctx, tmp, tcg_ctx->cpu_exclusive_addr, tcg_ctx->cpu_exclusive_val,
                                   cpu_reg(s, rt), get_mem_index(s),
                                   size | MO_ALIGN | s->be_data);
        tcg_gen_setcond_i64(tcg_ctx, TCG_COND_NE, tmp, tmp, tcg_ctx->cpu_exclusive_val);
    }
    tcg_gen_mov_i64(tcg_ctx, cpu_reg(s, rd), tmp);
    tcg_temp_free_i64(tcg_ctx, tmp);
    tcg_gen_br(tcg_ctx, done_label);

    gen_set_label(tcg_ctx, fail_label);
    tcg_gen_movi_i64(tcg_ctx, cpu_reg(s, rd), 1);
    gen_set_label(tcg_ctx, done_label);
    tcg_gen_movi_i64(tcg_ctx, tcg_ctx->cpu_exclusive_addr, -1);
}